

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

ProgramSources * __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicTriangleFillCoverCase::makeSources
          (ProgramSources *__return_storage_ptr__,BasicTriangleFillCoverCase *this,
          TessPrimitiveType primitiveType,SpacingMode spacing,char *vtxOutPosAttrName)

{
  Context *pCVar1;
  Context *pCVar2;
  ProgramSources *pPVar3;
  char *code;
  undefined1 usePointMode;
  char *local_380;
  string local_350;
  ShaderSource local_330;
  string local_308;
  ShaderSource local_2e8;
  string local_2c0;
  ShaderSource local_2a0;
  ProgramSources local_278;
  allocator<char> local_1a1;
  string local_1a0 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string tessellationEvaluationTemplate;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string vertexShaderTemplate;
  char *vtxOutPosAttrName_local;
  SpacingMode spacing_local;
  TessPrimitiveType primitiveType_local;
  BasicTriangleFillCoverCase *this_local;
  
  usePointMode = SUB81(vtxOutPosAttrName,0);
  vertexShaderTemplate.field_2._8_8_ = vtxOutPosAttrName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,vtxOutPosAttrName,&local_c9);
  std::operator+(&local_a8,"${GLSL_VERSION_DECL}\n\nin highp vec2 in_v_position;\n\nout highp vec2 "
                 ,&local_c8);
  std::operator+(&local_88,&local_a8,";\n\nvoid main (void)\n{\n\t");
  std::operator+(&local_68,&local_88,(char *)vertexShaderTemplate.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68," = in_v_position;\n}\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  code = (char *)0x0;
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)primitiveType,spacing,SPACINGMODE_EQUAL,
             (bool)usePointMode);
  std::operator+(&local_160,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragmentShaderTemplate.field_2 + 8));
  std::operator+(&local_140,&local_160,
                 "\nin highp vec2 in_te_position[];\n\nprecise gl_Position;\nvoid main (void)\n{\n")
  ;
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_380 = 
    "\n\thighp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n\thighp vec2 corner0 = in_te_position[0];\n\thighp vec2 corner1 = in_te_position[1];\n\thighp vec2 corner2 = in_te_position[2];\n\thighp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n\thighp vec2 fromCenter = pos - (corner0 + corner1 + corner2) / 3.0;\n\thighp float f = (1.0 - length(fromCenter)) * (1.5 - d);\n\tpos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n\tgl_Position = vec4(pos, 0.0, 1.0);\n"
    ;
  }
  else {
    local_380 = (char *)0x0;
    code = 
    "\thighp vec2 corner0 = in_te_position[0];\n\thighp vec2 corner1 = in_te_position[1];\n\thighp vec2 corner2 = in_te_position[2];\n\thighp vec2 corner3 = in_te_position[3];\n\thighp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n\t               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n\t               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n\t               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n\thighp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n\thighp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n\thighp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n\tpos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n\tgl_Position = vec4(pos, 0.0, 1.0);\n"
    ;
    if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
      local_380 = 
      "\thighp vec2 corner0 = in_te_position[0];\n\thighp vec2 corner1 = in_te_position[1];\n\thighp vec2 corner2 = in_te_position[2];\n\thighp vec2 corner3 = in_te_position[3];\n\thighp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n\t               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n\t               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n\t               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n\thighp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n\thighp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n\thighp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n\tpos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n\tgl_Position = vec4(pos, 0.0, 1.0);\n"
      ;
    }
  }
  std::operator+(&local_120,&local_140,local_380);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 &local_120,"}\n");
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n\to_color = vec4(1.0);\n}\n"
             ,&local_1a1);
  std::allocator<char>::~allocator(&local_1a1);
  glu::ProgramSources::ProgramSources(&local_278);
  pCVar1 = (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context;
  pCVar2 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2c0,(_anonymous_namespace_ *)pCVar1,pCVar2,code);
  glu::VertexSource::VertexSource((VertexSource *)&local_2a0,&local_2c0);
  pPVar3 = glu::ProgramSources::operator<<(&local_278,&local_2a0);
  pCVar1 = (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context;
  pCVar2 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_308,(_anonymous_namespace_ *)pCVar1,pCVar2,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_2e8,&local_308);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_2e8);
  pCVar1 = (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context;
  pCVar2 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_350,(_anonymous_namespace_ *)pCVar1,pCVar2,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_330,&local_350);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_330);
  glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar3);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  glu::VertexSource::~VertexSource((VertexSource *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  glu::ProgramSources::~ProgramSources(&local_278);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

const glu::ProgramSources makeSources (TessPrimitiveType primitiveType, SpacingMode spacing, const char* vtxOutPosAttrName) const
	{
		std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "\n"
													 "out highp vec2 " + string(vtxOutPosAttrName) + ";\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	" + vtxOutPosAttrName + " = in_v_position;\n"
													 "}\n");
		std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
													 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "${GPU_SHADER5_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(primitiveType, spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "precise gl_Position;\n"
													 "void main (void)\n"
													 "{\n"
													 + (primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"\n"
														"	highp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n"
														"	highp vec2 corner0 = in_te_position[0];\n"
														"	highp vec2 corner1 = in_te_position[1];\n"
														"	highp vec2 corner2 = in_te_position[2];\n"
														"	highp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n"
														"	highp vec2 fromCenter = pos - (corner0 + corner1 + corner2) / 3.0;\n"
														"	highp float f = (1.0 - length(fromCenter)) * (1.5 - d);\n"
														"	pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n"
														"	gl_Position = vec4(pos, 0.0, 1.0);\n"
													  : primitiveType == TESSPRIMITIVETYPE_QUADS ?
														"	highp vec2 corner0 = in_te_position[0];\n"
														"	highp vec2 corner1 = in_te_position[1];\n"
														"	highp vec2 corner2 = in_te_position[2];\n"
														"	highp vec2 corner3 = in_te_position[3];\n"
														"	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
														"	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
														"	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
														"	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
														"	highp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n"
														"	highp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n"
														"	highp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n"
														"	pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n"
														"	gl_Position = vec4(pos, 0.0, 1.0);\n"
													  : DE_NULL) +
													 "}\n");
		std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0);\n"
													 "}\n");

		return glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()));
	}